

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *segment_00;
  bool bVar1;
  ElementSize EVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  Kind KVar5;
  WordCountN<17> WVar6;
  ElementCountN<29> i_00;
  BitsPerElementTableType BVar7;
  word *refTarget;
  WirePointer *this;
  unsigned_short *puVar8;
  uint *puVar9;
  unsigned_long uVar10;
  MessageSizeCounts MVar11;
  Fault local_190;
  Fault f_8;
  Fault f_7;
  Iterator local_168;
  uint j;
  Iterator __end7;
  Iterator __begin7;
  Range<unsigned_int> *__range7;
  Iterator local_148;
  uint i_2;
  Iterator __end6;
  Iterator __begin6;
  Range<unsigned_int> *__range6;
  word *pos;
  WirePointerCount pointerCount;
  WordCount dataSize;
  Fault f_6;
  unsigned_long actualSize;
  Fault f_5;
  ListElementCount count_1;
  WirePointer *elementTag;
  Fault f_4;
  undefined1 auStack_e8 [4];
  WordCountN<29> wordCount;
  uint local_e0;
  uint local_d4;
  Iterator local_d0;
  uint i_1;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_int> *__range5;
  Fault f_3;
  uint count;
  Fault f_2;
  WordCount64 totalWords;
  uint local_90;
  ushort local_82;
  Iterator local_80;
  Iterator local_7e;
  Range<unsigned_short> RStack_7c;
  unsigned_short i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_short> *__range4;
  WirePointer *pointerSection;
  Fault f_1;
  word *p;
  word *ptr;
  Fault local_38;
  Fault f;
  WirePointer *pWStack_28;
  int nestingLimit_local;
  WirePointer *ref_local;
  SegmentReader *segment_local;
  MessageSizeCounts result;
  
  f.exception._4_4_ = nestingLimit;
  pWStack_28 = ref;
  ref_local = (WirePointer *)segment;
  memset(&segment_local,0,0x10);
  bVar1 = WirePointer::isNull(pWStack_28);
  if (!bVar1) {
    if (f.exception._4_4_ < 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x301,FAILED,"nestingLimit > 0","\"Message is too deeply-nested.\"",
                 (char (*) [30])"Message is too deeply-nested.");
      kj::_::Debug::Fault::~Fault(&local_38);
    }
    else {
      f.exception._4_4_ = f.exception._4_4_ + -1;
      refTarget = WirePointer::target(pWStack_28,(SegmentReader *)ref_local);
      f_1.exception =
           (Exception *)followFars(&stack0xffffffffffffffd8,refTarget,(SegmentReader **)&ref_local);
      this = (WirePointer *)kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&f_1);
      if (this != (WirePointer *)0x0) {
        KVar5 = WirePointer::kind(pWStack_28);
        segment_00 = ref_local;
        switch(KVar5) {
        case STRUCT:
          WVar6 = WirePointer::StructRef::wordSize(&(pWStack_28->field_1).structRef);
          bVar1 = boundsCheck((SegmentReader *)segment_00,(word *)this,WVar6);
          if (bVar1) {
            WVar6 = WirePointer::StructRef::wordSize(&(pWStack_28->field_1).structRef);
            MessageSizeCounts::addWords((MessageSizeCounts *)&segment_local,(ulong)WVar6);
            uVar3 = DirectWireValue<unsigned_short>::get(&(pWStack_28->field_1).structRef.dataSize);
            uVar4 = DirectWireValue<unsigned_short>::get(&(pWStack_28->field_1).structRef.ptrCount);
            RStack_7c = kj::zeroTo<unsigned_short>(uVar4);
            ___end4 = &stack0xffffffffffffff84;
            local_7e = kj::Range<unsigned_short>::begin(___end4);
            local_80 = kj::Range<unsigned_short>::end(___end4);
            while (bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_7e,&local_80),
                  bVar1) {
              puVar8 = kj::Range<unsigned_short>::Iterator::operator*(&local_7e);
              local_82 = *puVar8;
              MVar11 = totalSize((SegmentReader *)ref_local,
                                 this + (long)(int)(uint)uVar3 + (long)(int)(uint)local_82,
                                 f.exception._4_4_);
              totalWords = MVar11.wordCount;
              local_90 = MVar11.capCount;
              MessageSizeCounts::operator+=
                        ((MessageSizeCounts *)&segment_local,(MessageSizeCounts *)&totalWords);
              kj::Range<unsigned_short>::Iterator::operator++(&local_7e);
            }
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                      ((Fault *)&pointerSection,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x310,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                       "\"Message contained out-of-bounds struct pointer.\"",
                       (char (*) [48])"Message contained out-of-bounds struct pointer.");
            kj::_::Debug::Fault::~Fault((Fault *)&pointerSection);
          }
          break;
        case LIST:
          EVar2 = WirePointer::ListRef::elementSize(&(pWStack_28->field_1).listRef);
          switch(EVar2) {
          case VOID:
            break;
          case BIT:
          case BYTE:
          case TWO_BYTES:
          case FOUR_BYTES:
          case EIGHT_BYTES:
            i_00 = WirePointer::ListRef::elementCount(&(pWStack_28->field_1).listRef);
            uVar10 = upgradeBound<unsigned_long,unsigned_int>(i_00);
            EVar2 = WirePointer::ListRef::elementSize(&(pWStack_28->field_1).listRef);
            BVar7 = dataBitsPerElement(EVar2);
            f_2.exception = (Exception *)roundBitsUpToWords(uVar10 * BVar7);
            bVar1 = boundsCheck((SegmentReader *)ref_local,(word *)this,
                                (WordCountN<31>)f_2.exception);
            if (bVar1) {
              MessageSizeCounts::addWords
                        ((MessageSizeCounts *)&segment_local,(WordCountN<61,_uint64_t>)f_2.exception
                        );
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                        ((Fault *)&stack0xffffffffffffff58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x32a,FAILED,"boundsCheck(segment, ptr, totalWords)",
                         "\"Message contained out-of-bounds list pointer.\"",
                         (char (*) [46])"Message contained out-of-bounds list pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff58);
            }
            break;
          case POINTER:
            f_3.exception._4_4_ = WirePointer::ListRef::elementCount(&(pWStack_28->field_1).listRef)
            ;
            bVar1 = boundsCheck((SegmentReader *)ref_local,(word *)this,f_3.exception._4_4_);
            if (bVar1) {
              MessageSizeCounts::addWords
                        ((MessageSizeCounts *)&segment_local,(ulong)f_3.exception._4_4_);
              ___end5 = kj::zeroTo<unsigned_int>(f_3.exception._4_4_);
              i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end5);
              local_d0 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end5);
              while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=
                                       ((Iterator *)&i_1,&local_d0), bVar1) {
                puVar9 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
                local_d4 = *puVar9;
                MVar11 = totalSize((SegmentReader *)ref_local,this + local_d4,f.exception._4_4_);
                _auStack_e8 = MVar11.wordCount;
                local_e0 = MVar11.capCount;
                MessageSizeCounts::operator+=
                          ((MessageSizeCounts *)&segment_local,(MessageSizeCounts *)auStack_e8);
                kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
              }
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                        ((Fault *)&__range5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x334,FAILED,"boundsCheck(segment, ptr, count * WORDS_PER_POINTER)",
                         "\"Message contained out-of-bounds list pointer.\"",
                         (char (*) [46])"Message contained out-of-bounds list pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&__range5);
            }
            break;
          case INLINE_COMPOSITE:
            f_4.exception._4_4_ =
                 WirePointer::ListRef::inlineCompositeWordCount(&(pWStack_28->field_1).listRef);
            bVar1 = boundsCheck((SegmentReader *)ref_local,(word *)this,f_4.exception._4_4_ + 1);
            if (bVar1) {
              f_5.exception._4_4_ = WirePointer::inlineCompositeListElementCount(this);
              KVar5 = WirePointer::kind(this);
              if (KVar5 == STRUCT) {
                WVar6 = WirePointer::StructRef::wordSize(&(this->field_1).structRef);
                uVar10 = upgradeBound<unsigned_long,unsigned_int>(f_5.exception._4_4_);
                f_6.exception = (Exception *)(WVar6 * uVar10);
                if ((Exception *)(ulong)f_4.exception._4_4_ < f_6.exception) {
                  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                            ((Fault *)&pointerCount,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x352,FAILED,"actualSize <= wordCount",
                             "\"Struct list pointer\'s elements overran size.\"",
                             (char (*) [45])"Struct list pointer\'s elements overran size.");
                  kj::_::Debug::Fault::~Fault((Fault *)&pointerCount);
                }
                else {
                  MessageSizeCounts::addWords
                            ((MessageSizeCounts *)&segment_local,
                             (WordCountN<61,_uint64_t>)
                             ((long)&((f_6.exception)->ownFile).content.ptr + 1));
                  uVar3 = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.dataSize);
                  uVar4 = DirectWireValue<unsigned_short>::get(&(this->field_1).structRef.ptrCount);
                  if (uVar4 != 0) {
                    __range6 = (Range<unsigned_int> *)(this + 1);
                    ___end6 = kj::zeroTo<unsigned_int>(f_5.exception._4_4_);
                    i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end6);
                    local_148 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end6);
                    while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=
                                             ((Iterator *)&i_2,&local_148), bVar1) {
                      kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
                      __range6 = __range6 + uVar3;
                      ___end7 = kj::zeroTo<unsigned_int>((uint)uVar4);
                      j = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end7);
                      local_168 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end7);
                      while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=
                                               ((Iterator *)&j,&local_168), bVar1) {
                        kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&j);
                        MVar11 = totalSize((SegmentReader *)ref_local,(WirePointer *)__range6,
                                           f.exception._4_4_);
                        f_7.exception = (Exception *)MVar11.wordCount;
                        MessageSizeCounts::operator+=
                                  ((MessageSizeCounts *)&segment_local,(MessageSizeCounts *)&f_7);
                        __range6 = __range6 + 1;
                        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&j);
                      }
                      kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
                    }
                  }
                }
              }
              else {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                          ((Fault *)&actualSize,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x34b,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                           "\"Don\'t know how to handle non-STRUCT inline composite.\"",
                           (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
                kj::_::Debug::Fault::~Fault((Fault *)&actualSize);
              }
            }
            else {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                        ((Fault *)&elementTag,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x343,FAILED,
                         "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                         "\"Message contained out-of-bounds list pointer.\"",
                         (char (*) [46])"Message contained out-of-bounds list pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&elementTag);
            }
          }
          break;
        case FAR:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&f_8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x36f,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          kj::_::Debug::Fault::~Fault(&f_8);
          break;
        case OTHER:
          bVar1 = WirePointer::isCapability(pWStack_28);
          if (bVar1) {
            result.wordCount._0_4_ = (int)result.wordCount + 1;
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                      (&local_190,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x377,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                       (char (*) [22])"Unknown pointer type.");
            kj::_::Debug::Fault::~Fault(&local_190);
          }
        }
      }
    }
  }
  MVar11.capCount = (int)result.wordCount;
  MVar11.wordCount = (WordCountN<61,_uint64_t>)segment_local;
  MVar11._12_4_ = 0;
  return MVar11;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_MAYBE(p, followFars(ref, ref->target(segment), segment)) {
      ptr = p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size.") {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }